

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkSIprefix(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  double mult;
  precise_unit pVar7;
  double local_178;
  string local_150;
  undefined1 local_130 [8];
  precise_unit retunit_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring_2;
  double mux_2;
  undefined1 local_d8 [8];
  precise_unit retunit_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring_1;
  double mux_1;
  value_type c;
  string local_90;
  undefined1 local_70 [8];
  precise_unit retunit;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  double mux;
  bool threeAgain;
  uint64_t match_flags_local;
  string *unit_string_local;
  undefined8 local_10;
  
  bVar3 = false;
  uVar4 = std::__cxx11::string::size();
  if (2 < uVar4) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
    if (*pcVar5 == 'A') {
      bVar3 = true;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      ustring.field_2._8_8_ = getPrefixMultiplier2Char(cVar1,*pcVar5);
      if (((double)ustring.field_2._8_8_ != 0.0) || (NAN((double)ustring.field_2._8_8_))) {
        std::__cxx11::string::substr((ulong)local_58,(ulong)unit_string);
        lVar6 = std::__cxx11::string::size();
        if (lVar6 == 1) {
          pcVar5 = (char *)std::__cxx11::string::front();
          cVar1 = *pcVar5;
          if (cVar1 == 'B') {
            precise_unit::precise_unit
                      ((precise_unit *)&unit_string_local,(double)ustring.field_2._8_8_,
                       (precise_unit *)precise::data::byte);
            retunit.commodity_ = 1;
          }
          else if (cVar1 == 'b') {
            precise_unit::precise_unit
                      ((precise_unit *)&unit_string_local,(double)ustring.field_2._8_8_,
                       (precise_unit *)precise::data::bit);
            retunit.commodity_ = 1;
          }
          else {
            if (cVar1 != 'k') goto LAB_001b8f0e;
            unit_string_local = (string *)0x7ff4000000000000;
            local_10._0_4_ = (unit_data)0xfa94a488;
            local_10._4_4_ = 0;
            retunit.commodity_ = 1;
          }
        }
        else {
LAB_001b8f0e:
          std::__cxx11::string::string((string *)&local_90,local_58);
          pVar7 = unit_quick_match(&local_90,match_flags);
          retunit.multiplier_ = pVar7._8_8_;
          local_70 = (undefined1  [8])pVar7.multiplier_;
          std::__cxx11::string::~string((string *)&local_90);
          bVar2 = is_valid((precise_unit *)local_70);
          if (bVar2) {
            precise_unit::precise_unit
                      ((precise_unit *)&unit_string_local,(double)ustring.field_2._8_8_,
                       (precise_unit *)local_70);
            retunit.commodity_ = 1;
          }
          else {
            retunit.commodity_ = 0;
          }
        }
        std::__cxx11::string::~string(local_58);
        if (retunit.commodity_ != 0) goto LAB_001b949c;
      }
    }
  }
  uVar4 = std::__cxx11::string::size();
  if (1 < uVar4) {
    pcVar5 = (char *)std::__cxx11::string::front();
    mux_1._3_1_ = *pcVar5;
    if ((mux_1._3_1_ == 'N') && ((match_flags & 0x200) != 0)) {
      mux_1._3_1_ = 'n';
    }
    if ((match_flags & 0x100) == 0) {
      local_178 = getPrefixMultiplier(mux_1._3_1_);
    }
    else {
      local_178 = getStrictSIPrefixMultiplier(mux_1._3_1_);
    }
    if ((local_178 != 0.0) || (NAN(local_178))) {
      std::__cxx11::string::substr((ulong)&retunit_1.base_units_,(ulong)unit_string);
      lVar6 = std::__cxx11::string::size();
      if (lVar6 == 1) {
        pcVar5 = (char *)std::__cxx11::string::front();
        cVar1 = *pcVar5;
        if (cVar1 == 'B') {
          precise_unit::precise_unit
                    ((precise_unit *)&unit_string_local,local_178,
                     (precise_unit *)precise::data::byte);
          retunit.commodity_ = 1;
        }
        else if (cVar1 == 'b') {
          precise_unit::precise_unit
                    ((precise_unit *)&unit_string_local,local_178,(precise_unit *)precise::data::bit
                    );
          retunit.commodity_ = 1;
        }
        else {
          if (cVar1 != 'k') goto LAB_001b9182;
          unit_string_local = (string *)0x7ff4000000000000;
          local_10._0_4_ = (unit_data)0xfa94a488;
          local_10._4_4_ = 0;
          retunit.commodity_ = 1;
        }
      }
      else {
LAB_001b9182:
        std::__cxx11::string::string((string *)&mux_2,(string *)&retunit_1.base_units_);
        pVar7 = unit_quick_match((string *)&mux_2,match_flags);
        retunit_1.multiplier_ = pVar7._8_8_;
        local_d8 = (undefined1  [8])pVar7.multiplier_;
        std::__cxx11::string::~string((string *)&mux_2);
        bVar2 = is_error((precise_unit *)local_d8);
        if (bVar2) {
          retunit.commodity_ = 0;
        }
        else {
          precise_unit::precise_unit
                    ((precise_unit *)&unit_string_local,local_178,(precise_unit *)local_d8);
          retunit.commodity_ = 1;
        }
      }
      std::__cxx11::string::~string((string *)&retunit_1.base_units_);
      if (retunit.commodity_ != 0) goto LAB_001b949c;
    }
  }
  if (bVar3) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
    cVar1 = *pcVar5;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
    mult = getPrefixMultiplier2Char(cVar1,*pcVar5);
    if ((mult != 0.0) || (NAN(mult))) {
      std::__cxx11::string::substr((ulong)&retunit_2.base_units_,(ulong)unit_string);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &retunit_2.base_units_,"B");
      if (bVar3) {
        precise_unit::precise_unit
                  ((precise_unit *)&unit_string_local,mult,(precise_unit *)precise::data::byte);
        retunit.commodity_ = 1;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&retunit_2.base_units_,"b");
        if (bVar3) {
          precise_unit::precise_unit
                    ((precise_unit *)&unit_string_local,mult,(precise_unit *)precise::data::bit);
          retunit.commodity_ = 1;
        }
        else {
          std::__cxx11::string::string((string *)&local_150,(string *)&retunit_2.base_units_);
          pVar7 = unit_quick_match(&local_150,match_flags);
          retunit_2.multiplier_ = pVar7._8_8_;
          local_130 = (undefined1  [8])pVar7.multiplier_;
          std::__cxx11::string::~string((string *)&local_150);
          bVar3 = is_valid((precise_unit *)local_130);
          if (bVar3) {
            precise_unit::precise_unit
                      ((precise_unit *)&unit_string_local,mult,(precise_unit *)local_130);
            retunit.commodity_ = 1;
          }
          else {
            retunit.commodity_ = 0;
          }
        }
      }
      std::__cxx11::string::~string((string *)&retunit_2.base_units_);
      if (retunit.commodity_ != 0) goto LAB_001b949c;
    }
  }
  unit_string_local = (string *)0x7ff4000000000000;
  local_10._0_4_ = (unit_data)0xfa94a488;
  local_10._4_4_ = 0;
LAB_001b949c:
  pVar7.base_units_ = local_10._0_4_;
  pVar7.commodity_ = local_10._4_4_;
  pVar7.multiplier_ = (double)unit_string_local;
  return pVar7;
}

Assistant:

static precise_unit
    checkSIprefix(const std::string& unit_string, std::uint64_t match_flags)
{
    bool threeAgain{false};
    if (unit_string.size() >= 3) {
        if (unit_string[1] == 'A') {
            threeAgain = true;
        } else {
            auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
            if (mux != 0.0) {
                auto ustring = unit_string.substr(2);
                if (ustring.size() == 1) {
                    switch (ustring.front()) {
                        case 'B':
                            return {mux, precise::data::byte};
                        case 'b':
                            return {mux, precise::data::bit};
                        case 'k':
                            return precise::invalid;
                        default:
                            break;
                    }
                }

                auto retunit = unit_quick_match(ustring, match_flags);
                if (is_valid(retunit)) {
                    return {mux, retunit};
                }
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto c = unit_string.front();
        if (c == 'N' && ((match_flags & case_insensitive) != 0)) {
            c = 'n';
        }
        auto mux = ((match_flags & strict_si) == 0) ?
            getPrefixMultiplier(c) :
            getStrictSIPrefixMultiplier(c);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(1);
            if (ustring.size() == 1) {
                switch (ustring.front()) {
                    case 'B':
                        return {mux, precise::data::byte};
                    case 'b':
                        return {mux, precise::data::bit};
                    case 'k':
                        return precise::invalid;
                    default:
                        break;
                }
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return {mux, retunit};
            }
        }
    }
    if (threeAgain) {
        auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(2);
            if (ustring == "B") {
                return {mux, precise::data::byte};
            }
            if (ustring == "b") {
                return {mux, precise::data::bit};
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (is_valid(retunit)) {
                return {mux, retunit};
            }
        }
    }
    return precise::invalid;
}